

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iopause.c
# Opt level: O2

void iopause(iopause_fd *x,uint len,taia *deadline,taia *stamp)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  timeval tv;
  taia t;
  fd_set wfds;
  fd_set rfds;
  
  uVar3 = (ulong)len;
  iVar4 = taia_less(deadline,stamp);
  iVar5 = 0;
  if (iVar4 == 0) {
    t.atto = stamp->atto;
    t.sec.x = (stamp->sec).x;
    t.nano = stamp->nano;
    taia_sub(&t,deadline,&t);
    dVar10 = taia_approx(&t);
    dVar11 = 1000.0;
    if (dVar10 <= 1000.0) {
      dVar11 = dVar10;
    }
    iVar5 = (int)(dVar11 * 1000.0 + 20.0);
  }
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    x[uVar6].revents = 0;
  }
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    rfds.__fds_bits[lVar7] = 0;
  }
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    wfds.__fds_bits[lVar7] = 0;
  }
  iVar4 = 1;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = x[uVar6].fd;
    if (uVar2 < 0x400) {
      iVar9 = uVar2 + 1;
      if ((int)uVar2 < iVar4) {
        iVar9 = iVar4;
      }
      uVar1 = x[uVar6].events;
      if ((uVar1 & 1) != 0) {
        rfds.__fds_bits[uVar2 >> 6] = rfds.__fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
      }
      iVar4 = iVar9;
      if ((uVar1 & 4) != 0) {
        wfds.__fds_bits[uVar2 >> 6] = wfds.__fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  tv.tv_sec = (__time_t)(iVar5 / 1000);
  tv.tv_usec = (__suseconds_t)((iVar5 % 1000) * 1000);
  iVar4 = select(iVar4,(fd_set *)&rfds,(fd_set *)&wfds,(fd_set *)0x0,(timeval *)&tv);
  if (0 < iVar4) {
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = x[uVar6].fd;
      uVar8 = (ulong)uVar2;
      if (uVar8 < 0x400) {
        if (((x[uVar6].events & 1U) != 0) &&
           (((ulong)rfds.__fds_bits[uVar2 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar6].revents = (byte)x[uVar6].revents | 1;
        }
        if (((x[uVar6].events & 4U) != 0) &&
           (((ulong)wfds.__fds_bits[uVar2 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar6].revents = (byte)x[uVar6].revents | 4;
        }
      }
    }
  }
  return;
}

Assistant:

void iopause(iopause_fd *x,unsigned int len,struct taia *deadline,struct taia *stamp)
{
  struct taia t;
  int millisecs;
  double d;
  int i;

  if (taia_less(deadline,stamp))
    millisecs = 0;
  else {
    t = *stamp;
    taia_sub(&t,deadline,&t);
    d = taia_approx(&t);
    if (d > 1000.0) d = 1000.0;
    millisecs = d * 1000.0 + 20.0;
  }

  for (i = 0;i < len;++i)
    x[i].revents = 0;

#ifdef IOPAUSE_POLL

  poll(x,len,millisecs);
  /* XXX: some kernels apparently need x[0] even if len is 0 */
  /* XXX: how to handle EAGAIN? are kernels really this dumb? */
  /* XXX: how to handle EINVAL? when exactly can this happen? */

#else
{

  struct timeval tv;
  fd_set rfds;
  fd_set wfds;
  int nfds;
  int fd;

  FD_ZERO(&rfds);
  FD_ZERO(&wfds);

  nfds = 1;
  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (fd >= nfds) nfds = fd + 1;
    if (x[i].events & IOPAUSE_READ) FD_SET(fd,&rfds);
    if (x[i].events & IOPAUSE_WRITE) FD_SET(fd,&wfds);
  }

  tv.tv_sec = millisecs / 1000;
  tv.tv_usec = 1000 * (millisecs % 1000);

  if (select(nfds,&rfds,&wfds,(fd_set *) 0,&tv) <= 0)
    return;
    /* XXX: for EBADF, could seek out and destroy the bad descriptor */

  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (x[i].events & IOPAUSE_READ)
      if (FD_ISSET(fd,&rfds)) x[i].revents |= IOPAUSE_READ;
    if (x[i].events & IOPAUSE_WRITE)
      if (FD_ISSET(fd,&wfds)) x[i].revents |= IOPAUSE_WRITE;
  }

}
#endif

}